

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteBuiltin_db_store(jx9_context *pCtx,int argc,jx9_value **argv)

{
  int iVar1;
  unqlite_col *pCol_00;
  uint local_5c;
  int i;
  int rc;
  int nByte;
  SyString sName;
  unqlite_vm *pVm;
  char *zName;
  unqlite_col *pCol;
  jx9_value **argv_local;
  int argc_local;
  jx9_context *pCtx_local;
  
  if (argc < 2) {
    jx9_context_throw_error(pCtx,1,"Missing collection name and/or records");
    jx9_result_bool(pCtx,0);
  }
  else {
    _rc = jx9_value_to_string(*argv,&i);
    if (i < 1) {
      jx9_context_throw_error(pCtx,1,"Invalid collection name");
      jx9_result_bool(pCtx,0);
    }
    else {
      sName.zString._0_4_ = i;
      sName._8_8_ = jx9_context_user_data(pCtx);
      pCol_00 = unqliteCollectionFetch((unqlite_vm *)sName._8_8_,(SyString *)&rc,4);
      if (pCol_00 == (unqlite_col *)0x0) {
        jx9_context_throw_error_format(pCtx,1,"No such collection \'%z\'",&rc);
        jx9_result_bool(pCtx,0);
      }
      else {
        for (local_5c = 1; (int)local_5c < argc; local_5c = local_5c + 1) {
          iVar1 = unqliteCollectionPut(pCol_00,argv[(int)local_5c],0);
          if (iVar1 != 0) {
            jx9_context_throw_error_format
                      (pCtx,1,"Error while storing record %d in collection \'%z\'",(ulong)local_5c,
                       &rc);
            jx9_result_bool(pCtx,0);
            return 0;
          }
        }
        jx9_result_bool(pCtx,1);
      }
    }
  }
  return 0;
}

Assistant:

static int unqliteBuiltin_db_store(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	int rc;
	int i;
	/* Extract collection name */
	if( argc < 2 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name and/or records");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol == 0 ){
		jx9_context_throw_error_format(pCtx,JX9_CTX_ERR,"No such collection '%z'",&sName);
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	/* Store the given values */
	for( i = 1 ; i < argc ; ++i ){
		rc = unqliteCollectionPut(pCol,argv[i],0);
		if( rc != UNQLITE_OK){
			jx9_context_throw_error_format(pCtx,JX9_CTX_ERR,
				"Error while storing record %d in collection '%z'",i,&sName
				);
			/* Return false */
			jx9_result_bool(pCtx,0);
			return JX9_OK;
		}
	}
	/* All done, return TRUE */
	jx9_result_bool(pCtx,1);
	return JX9_OK;
}